

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QRectF * __thiscall
QGraphicsItem::sceneBoundingRect(QRectF *__return_storage_ptr__,QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsItem *pQVar3;
  long in_FS_OFFSET;
  QGraphicsItem *that;
  double local_58;
  double dStack_50;
  undefined1 local_48 [12];
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  QGraphicsItem *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0.0;
  dStack_50 = 0.0;
  pQVar3 = this;
  do {
    pQVar1 = (pQVar3->d_ptr).d;
    if (pQVar1->transformData != (TransformData *)0x0) goto LAB_005dd1cd;
    local_58 = local_58 + (pQVar1->pos).xp;
    dStack_50 = dStack_50 + (pQVar1->pos).yp;
    pQVar3 = pQVar1->parent;
  } while (pQVar3 != (QGraphicsItem *)0x0);
  pQVar3 = (QGraphicsItem *)0x0;
LAB_005dd1cd:
  local_38 = 0xffffffff;
  uStack_34 = 0xffffffff;
  uStack_30 = 0xffffffff;
  uStack_2c = 0xffffffff;
  local_48._8_4_ = 0xffffffff;
  local_48._0_8_ = 0xffffffffffffffff;
  uStack_3c = 0xffffffff;
  (*this->_vptr_QGraphicsItem[3])(local_48);
  local_58 = local_58 + (double)local_48._0_8_;
  dStack_50 = dStack_50 + stack0xffffffffffffffc0;
  local_48._8_4_ = SUB84(dStack_50,0);
  local_48._0_8_ = local_58;
  uStack_3c = (int)((ulong)dStack_50 >> 0x20);
  if (pQVar3 == (QGraphicsItem *)0x0) {
    __return_storage_ptr__->w = (qreal)CONCAT44(uStack_34,local_38);
    __return_storage_ptr__->h = (qreal)CONCAT44(uStack_2c,uStack_30);
  }
  else {
    pQVar1 = (pQVar3->d_ptr).d;
    local_28 = pQVar1->q_ptr;
    QGraphicsItemPrivate::ensureSceneTransformRecursive(pQVar1,&local_28);
    pQVar2 = (pQVar3->d_ptr).d;
    if ((pQVar1->field_0x167 & 0x40) == 0) {
      QTransform::mapRect(__return_storage_ptr__);
      goto LAB_005dd277;
    }
    local_58 = (pQVar2->sceneTransform).m_matrix[2][0] + (double)local_48._0_8_;
    dStack_50 = (pQVar2->sceneTransform).m_matrix[2][1] + stack0xffffffffffffffc0;
    local_48._8_4_ = SUB84(dStack_50,0);
    local_48._0_8_ = local_58;
    uStack_3c = (int)((ulong)dStack_50 >> 0x20);
    __return_storage_ptr__->w = (qreal)CONCAT44(uStack_34,local_38);
    __return_storage_ptr__->h = (qreal)CONCAT44(uStack_2c,uStack_30);
  }
  __return_storage_ptr__->xp = local_58;
  __return_storage_ptr__->yp = dStack_50;
LAB_005dd277:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QGraphicsItem::sceneBoundingRect() const
{
    // Find translate-only offset
    // COMBINE
    QPointF offset;
    const QGraphicsItem *parentItem = this;
    const QGraphicsItemPrivate *itemd;
    do {
        itemd = parentItem->d_ptr.data();
        if (itemd->transformData)
            break;
        offset += itemd->pos;
    } while ((parentItem = itemd->parent));

    QRectF br = boundingRect();
    br.translate(offset);
    if (!parentItem)
        return br;
    if (parentItem->d_ptr->hasTranslateOnlySceneTransform()) {
        br.translate(parentItem->d_ptr->sceneTransform.dx(), parentItem->d_ptr->sceneTransform.dy());
        return br;
    }
    return parentItem->d_ptr->sceneTransform.mapRect(br);
}